

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O2

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit(AnalysisScopeVisitor *this,ClassType *symbol)

{
  AnalyzedScope *pAVar1;
  PendingAnalysis local_18;
  
  pAVar1 = this->result;
  local_18 = AnalysisManager::analyzeSymbol(this->manager,(Symbol *)symbol);
  std::vector<slang::analysis::PendingAnalysis,_std::allocator<slang::analysis::PendingAnalysis>_>::
  emplace_back<slang::analysis::PendingAnalysis>(&pAVar1->childScopes,&local_18);
  return;
}

Assistant:

void visit(const ClassType& symbol) {
        result.childScopes.emplace_back(manager.analyzeSymbol(symbol));
    }